

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_custom_check.cpp
# Opt level: O0

void __thiscall money_t::~money_t(money_t *this)

{
  money_t *this_local;
  
  ~money_t(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~money_t() {}